

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O3

Type * slang::ast::PackedStructType::fromSyntax
                 (Compilation *comp,StructUnionTypeSyntax *syntax,ASTContext *parentContext)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> this;
  bool *pbVar1;
  size_t sVar2;
  SyntaxNode *syntax_00;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar3;
  long lVar4;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  bool bVar5;
  bool bVar6;
  bitwidth_t bVar7;
  uint uVar8;
  PackedStructType *pPVar9;
  Type *this_00;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar10;
  Type *pTVar11;
  Diagnostic *pDVar12;
  SourceLocation SVar13;
  pointer ppSVar14;
  ulong uVar15;
  long lVar16;
  SourceRange SVar17;
  bool isSigned;
  FieldSymbol *field;
  ASTContext context;
  SmallVector<slang::ast::FieldSymbol_*,_5UL> members;
  bool local_111;
  StructUnionMemberSyntax *local_110;
  Compilation *local_108;
  PackedStructType *local_100;
  Token local_f8;
  uint local_e8 [2];
  StructUnionTypeSyntax *local_e0;
  Scope *local_d8;
  FieldSymbol *local_d0;
  ASTContext *local_c8;
  pointer local_c0;
  pointer local_b8;
  SourceLocation local_b0;
  ASTContext local_a8;
  SourceLocation local_70;
  long local_68;
  undefined8 local_60;
  undefined1 local_58 [40];
  
  local_111 = (syntax->signing).kind == SignedKeyword;
  local_70 = parsing::Token::location(&syntax->keyword);
  local_108 = comp;
  pPVar9 = BumpAllocator::
           emplace<slang::ast::PackedStructType,slang::ast::Compilation&,bool_const&,slang::SourceLocation,slang::ast::ASTContext_const&>
                     (&comp->super_BumpAllocator,comp,&local_111,&local_70,parentContext);
  (pPVar9->super_IntegralType).super_Type.super_Symbol.originatingSyntax = (SyntaxNode *)syntax;
  local_d8 = &pPVar9->super_Scope;
  local_a8.flags.m_bits = (parentContext->flags).m_bits;
  local_a8.lookupIndex = 0xffffffff;
  local_a8.instanceOrProc = (Symbol *)0x0;
  local_a8.firstTempVar = (TempVarSymbol *)0x0;
  local_a8.randomizeDetails = (RandomizeDetails *)0x0;
  local_a8.assertionInstance = (AssertionInstanceDetails *)0x0;
  local_70 = (SourceLocation)local_58;
  local_68 = 0;
  local_60 = 5;
  sVar2 = (syntax->members).
          super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  local_c8 = parentContext;
  local_a8.scope.ptr = local_d8;
  if (sVar2 == 0) {
    if ((pPVar9->super_IntegralType).bitWidth == 0) goto LAB_0031ddad;
  }
  else {
    ppSVar14 = (syntax->members).
               super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>._M_ptr;
    local_c0 = ppSVar14 + sVar2;
    bVar5 = false;
    local_100 = pPVar9;
    local_e0 = syntax;
    do {
      pPVar9 = local_100;
      local_110 = *ppSVar14;
      syntax_00 = (local_110->super_SyntaxNode).previewNode;
      if (syntax_00 != (SyntaxNode *)0x0) {
        Scope::addMembers(local_d8,syntax_00);
      }
      this_00 = Compilation::getType(local_108,(local_110->type).ptr,&local_a8,(Type *)0x0);
      bVar6 = Type::isFourState(this_00);
      pbVar1 = &(pPVar9->super_IntegralType).isFourState;
      *pbVar1 = (bool)(*pbVar1 | bVar6);
      pTVar11 = this_00->canonical;
      if (pTVar11 == (Type *)0x0) {
        Type::resolveCanonical(this_00);
        pTVar11 = this_00->canonical;
      }
      bVar6 = !bVar5;
      bVar5 = true;
      local_b8 = ppSVar14;
      if (bVar6 && (pTVar11->super_Symbol).kind != ErrorType) {
        bVar6 = Type::isIntegral(this_00);
        if (bVar6) {
          bVar5 = false;
        }
        else {
          local_f8 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)(local_110->type).ptr);
          SVar13 = parsing::Token::location(&local_f8);
          pDVar12 = ASTContext::addDiag(&local_a8,(DiagCode)0x1c0009,SVar13);
          ast::operator<<(pDVar12,this_00);
          SVar17 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)(local_110->type).ptr);
          Diagnostic::operator<<(pDVar12,SVar17);
        }
      }
      uVar15 = (local_110->declarators).elements._M_extent._M_extent_value + 1;
      if (1 < uVar15) {
        uVar15 = uVar15 >> 1;
        lVar16 = 0;
        do {
          ppSVar10 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                               ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *
                                )((long)&(((local_110->declarators).elements._M_ptr)->
                                         super_ConstTokenOrSyntax).
                                         super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                         .
                                         super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                         .
                                         super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                         .
                                         super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                 + lVar16));
          pSVar3 = *ppSVar10;
          this = pSVar3 + 1;
          local_f8 = (Token)parsing::Token::valueText((Token *)this);
          local_b0 = parsing::Token::location((Token *)this);
          local_e8[1] = 0;
          local_e8[0] = (uint)local_68;
          local_d0 = BumpAllocator::
                     emplace<slang::ast::FieldSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,unsigned_int,unsigned_int>
                               (&local_108->super_BumpAllocator,
                                (basic_string_view<char,_std::char_traits<char>_> *)&local_f8,
                                &local_b0,local_e8 + 1,local_e8);
          (local_d0->super_VariableSymbol).super_ValueSymbol.declaredType.type = this_00;
          (local_d0->super_VariableSymbol).super_ValueSymbol.super_Symbol.originatingSyntax = pSVar3
          ;
          syntax_01._M_ptr =
               (local_110->attributes).
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
          syntax_01._M_extent._M_extent_value =
               (local_110->attributes).
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
               _M_extent._M_extent_value;
          Symbol::setAttributes((Symbol *)local_d0,local_a8.scope.ptr,syntax_01);
          Scope::insertMember(local_d8,(Symbol *)local_d0,(local_100->super_Scope).lastMember,false,
                              true);
          SmallVectorBase<slang::ast::FieldSymbol*>::emplace_back<slang::ast::FieldSymbol*const&>
                    ((SmallVectorBase<slang::ast::FieldSymbol*> *)&local_70,&local_d0);
          pTVar11 = Compilation::getType
                              (local_108,this_00,
                               (SyntaxList<slang::syntax::VariableDimensionSyntax> *)
                               &pSVar3[1].previewNode,&local_a8);
          bVar6 = Type::isUnpackedArray(pTVar11);
          if ((bVar6) && (!bVar5)) {
            SVar17 = parsing::Token::range((Token *)this);
            pDVar12 = ASTContext::addDiag(&local_a8,(DiagCode)0x1c0009,SVar17);
            ast::operator<<(pDVar12,pTVar11);
            SVar17 = slang::syntax::SyntaxNode::sourceRange(pSVar3 + 2);
            bVar5 = true;
            Diagnostic::operator<<(pDVar12,SVar17);
          }
          bVar7 = Type::getBitWidth(this_00);
          uVar8 = bVar7 + (local_100->super_IntegralType).bitWidth;
          (local_100->super_IntegralType).bitWidth = uVar8;
          if ((!bVar5) && (0xffffff < uVar8)) {
            SVar17 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_e0);
            pDVar12 = ASTContext::addDiag(&local_a8,(DiagCode)0x1d0009,SVar17);
            local_f8._0_8_ = (ulong)(local_100->super_IntegralType).bitWidth;
            std::
            vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            ::emplace_back<unsigned_long>(&pDVar12->args,(unsigned_long *)&local_f8);
            local_f8.kind = ~Unknown;
            local_f8._2_1_ = 0xff;
            local_f8.numFlags.raw = '\0';
            local_f8.rawLen = 0;
            std::
            vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            ::emplace_back<unsigned_long>(&pDVar12->args,(unsigned_long *)&local_f8);
            goto LAB_0031ddad;
          }
          if (*(long *)(pSVar3 + 4) != 0) {
            SVar13 = parsing::Token::location((Token *)(*(long *)(pSVar3 + 4) + 0x18));
            pDVar12 = ASTContext::addDiag(&local_a8,(DiagCode)0x1b0009,SVar13);
            SVar17 = slang::syntax::SyntaxNode::sourceRange
                               (*(SyntaxNode **)(*(long *)(pSVar3 + 4) + 0x28));
            Diagnostic::operator<<(pDVar12,SVar17);
          }
          lVar16 = lVar16 + 0x30;
          uVar15 = uVar15 - 1;
        } while (uVar15 != 0);
      }
      ppSVar14 = local_b8 + 1;
    } while (ppSVar14 != local_c0);
    pPVar9 = local_100;
    syntax = local_e0;
    if ((local_100->super_IntegralType).bitWidth == 0 || bVar5) {
LAB_0031ddad:
      pTVar11 = local_108->errorType;
      goto LAB_0031de22;
    }
  }
  SVar13 = local_70;
  if (local_68 != 0) {
    lVar16 = local_68 << 3;
    uVar15 = 0;
    do {
      lVar4 = *(long *)((undefined1 *)((long)SVar13 + -8) + lVar16);
      *(ulong *)(lVar4 + 0x158) = uVar15;
      pTVar11 = DeclaredType::getType((DeclaredType *)(lVar4 + 0x40));
      bVar7 = Type::getBitWidth(pTVar11);
      uVar15 = (ulong)((int)uVar15 + bVar7);
      lVar16 = lVar16 + -8;
    } while (lVar16 != 0);
  }
  pTVar11 = anon_unknown.dwarf_f48d9b::createPackedDims(local_c8,(Type *)pPVar9,&syntax->dimensions)
  ;
LAB_0031de22:
  if (local_70 != (SourceLocation)local_58) {
    operator_delete((void *)local_70);
  }
  return pTVar11;
}

Assistant:

const Type& PackedStructType::fromSyntax(Compilation& comp, const StructUnionTypeSyntax& syntax,
                                         const ASTContext& parentContext) {
    SLANG_ASSERT(syntax.packed);
    const bool isSigned = syntax.signing.kind == TokenKind::SignedKeyword;
    bool issuedError = false;

    auto structType = comp.emplace<PackedStructType>(comp, isSigned, syntax.keyword.location(),
                                                     parentContext);
    structType->setSyntax(syntax);

    ASTContext context(*structType, LookupLocation::max, parentContext.flags);

    SmallVector<FieldSymbol*> members;
    for (auto member : syntax.members) {
        if (member->previewNode)
            structType->addMembers(*member->previewNode);

        const Type& type = comp.getType(*member->type, context);
        structType->isFourState |= type.isFourState();
        issuedError |= type.isError();

        if (!issuedError && !type.isIntegral()) {
            issuedError = true;
            auto& diag = context.addDiag(diag::PackedMemberNotIntegral,
                                         member->type->getFirstToken().location());
            diag << type;
            diag << member->type->sourceRange();
        }

        for (auto decl : member->declarators) {
            auto field = comp.emplace<FieldSymbol>(decl->name.valueText(), decl->name.location(),
                                                   0u, (uint32_t)members.size());
            field->setType(type);
            field->setSyntax(*decl);
            field->setAttributes(*context.scope, member->attributes);
            structType->addMember(*field);
            members.push_back(field);

            // Unpacked arrays are disallowed in packed structs.
            if (const Type& dimType = comp.getType(type, decl->dimensions, context);
                dimType.isUnpackedArray() && !issuedError) {

                auto& diag = context.addDiag(diag::PackedMemberNotIntegral, decl->name.range());
                diag << dimType;
                diag << decl->dimensions.sourceRange();
                issuedError = true;
            }

            structType->bitWidth += type.getBitWidth();
            if (!issuedError && structType->bitWidth > (uint32_t)SVInt::MAX_BITS) {
                context.addDiag(diag::PackedTypeTooLarge, syntax.sourceRange())
                    << structType->bitWidth << (uint32_t)SVInt::MAX_BITS;
                return comp.getErrorType();
            }

            if (decl->initializer) {
                auto& diag = context.addDiag(diag::PackedMemberHasInitializer,
                                             decl->initializer->equals.location());
                diag << decl->initializer->expr->sourceRange();
            }
        }
    }

    if (!structType->bitWidth || issuedError)
        return comp.getErrorType();

    // We added the fields in reverse order, so compute their actual
    // offsets in the right order now.
    bitwidth_t offset = 0;
    for (auto member : std::views::reverse(members)) {
        member->bitOffset = offset;
        offset += member->getType().getBitWidth();
    }

    return createPackedDims(parentContext, structType, syntax.dimensions);
}